

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3RootPageMoved(sqlite3 *db,int iDb,int iFrom,int iTo)

{
  Schema *pSVar1;
  HashElem *pHVar2;
  
  pSVar1 = db->aDb[iDb].pSchema;
  for (pHVar2 = (pSVar1->tblHash).first; pHVar2 != (HashElem *)0x0; pHVar2 = pHVar2->next) {
    if (*(int *)((long)pHVar2->data + 0x3c) == iFrom) {
      *(int *)((long)pHVar2->data + 0x3c) = iTo;
    }
  }
  for (pHVar2 = (pSVar1->idxHash).first; pHVar2 != (HashElem *)0x0; pHVar2 = pHVar2->next) {
    if (*(int *)((long)pHVar2->data + 0x48) == iFrom) {
      *(int *)((long)pHVar2->data + 0x48) = iTo;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3RootPageMoved(sqlite3 *db, int iDb, int iFrom, int iTo){
  HashElem *pElem;
  Hash *pHash;
  Db *pDb;

  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
  pDb = &db->aDb[iDb];
  pHash = &pDb->pSchema->tblHash;
  for(pElem=sqliteHashFirst(pHash); pElem; pElem=sqliteHashNext(pElem)){
    Table *pTab = sqliteHashData(pElem);
    if( pTab->tnum==iFrom ){
      pTab->tnum = iTo;
    }
  }
  pHash = &pDb->pSchema->idxHash;
  for(pElem=sqliteHashFirst(pHash); pElem; pElem=sqliteHashNext(pElem)){
    Index *pIdx = sqliteHashData(pElem);
    if( pIdx->tnum==iFrom ){
      pIdx->tnum = iTo;
    }
  }
}